

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoutils.c
# Opt level: O1

int is_constant(double *x,int N)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = macheps();
  if (1 < N) {
    uVar1 = 1;
    do {
      if (dVar2 < ABS(x[uVar1] - x[uVar1 - 1])) {
        return 0;
      }
      uVar1 = uVar1 + 1;
    } while ((uint)N != uVar1);
  }
  return 1;
}

Assistant:

int is_constant(double *x, int N) {
    int i, cst;
    double eps,tmp;

    eps = macheps();
    cst = 1;

    for(i = 1; i < N;++i) {
        tmp = x[i] - x[i-1];
        if (fabs(tmp) > eps) {
            return 0;
        }
    }

    return cst;
}